

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.cpp
# Opt level: O2

RealType __thiscall OpenMD::AtomType::getMass(AtomType *this)

{
  mapped_type_conflict1 mVar1;
  mapped_type_conflict1 *pmVar2;
  RealType RVar3;
  allocator<char> local_39;
  key_type local_38;
  
  if (this->hasBase_ == true) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"mass",&local_39);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&this->myResponsibilities_,&local_38);
    mVar1 = *pmVar2;
    std::__cxx11::string::~string((string *)&local_38);
    if (mVar1 == false) {
      RVar3 = getMass(this->base_);
      return RVar3;
    }
  }
  return this->mass_;
}

Assistant:

RealType AtomType::getMass(void) {
    if (hasBase_ && !myResponsibilities_["mass"])
      return base_->getMass();
    else
      return mass_;
  }